

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

CPubKey * __thiscall EllSwiftPubKey::Decode(EllSwiftPubKey *this)

{
  size_type sVar1;
  iterator pbegin;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  size_t sz;
  array<unsigned_char,_33UL> vch_bytes;
  secp256k1_pubkey pubkey;
  array<std::byte,_64UL> *in_stack_ffffffffffffff48;
  array<unsigned_char,_33UL> *this_00;
  CPubKey *this_01;
  uint in_stack_ffffffffffffffac;
  secp256k1_pubkey *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  secp256k1_context *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffe8;
  secp256k1_pubkey *in_stack_fffffffffffffff0;
  secp256k1_context *ctx;
  
  ctx = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::array<std::byte,_64UL>::data(in_stack_ffffffffffffff48);
  UCharCast(in_stack_ffffffffffffff48->_M_elems);
  secp256k1_ellswift_decode(ctx,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::array<unsigned_char,_33UL>::data((array<unsigned_char,_33UL> *)in_stack_ffffffffffffff48);
  secp256k1_ec_pubkey_serialize
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  sVar1 = std::array<unsigned_char,_33UL>::size
                    ((array<unsigned_char,_33UL> *)in_stack_ffffffffffffff48);
  if (sVar1 != 0x21) {
    __assert_fail("sz == vch_bytes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x170,"CPubKey EllSwiftPubKey::Decode() const");
  }
  this_00 = (array<unsigned_char,_33UL> *)&stack0xffffffffffffff97;
  pbegin = std::array<unsigned_char,_33UL>::begin(this_00);
  std::array<unsigned_char,_33UL>::end(this_00);
  CPubKey::CPubKey<unsigned_char*>(this_01,pbegin,this_00->_M_elems);
  if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) == ctx) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CPubKey EllSwiftPubKey::Decode() const
{
    secp256k1_pubkey pubkey;
    secp256k1_ellswift_decode(secp256k1_context_static, &pubkey, UCharCast(m_pubkey.data()));

    size_t sz = CPubKey::COMPRESSED_SIZE;
    std::array<uint8_t, CPubKey::COMPRESSED_SIZE> vch_bytes;

    secp256k1_ec_pubkey_serialize(secp256k1_context_static, vch_bytes.data(), &sz, &pubkey, SECP256K1_EC_COMPRESSED);
    assert(sz == vch_bytes.size());

    return CPubKey{vch_bytes.begin(), vch_bytes.end()};
}